

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O2

cio_error cio_eventloop_run(cio_eventloop *loop)

{
  cio_event_notifier *evn;
  uint uVar1;
  int *piVar2;
  uint uVar3;
  cio_epoll_error cStack_40;
  
  do {
    while (uVar1 = epoll_wait(loop->epoll_fd,(epoll_event *)loop->epoll_events,100,-1),
          -1 < (int)uVar1) {
      loop->num_events = uVar1;
      uVar3 = 0;
      while (loop->event_counter = uVar3, uVar3 < uVar1) {
        evn = (cio_event_notifier *)loop->epoll_events[uVar3].data.u64;
        if (evn == &loop->stop_ev) {
          return CIO_SUCCESS;
        }
        uVar1 = loop->epoll_events[uVar3].events;
        loop->current_ev = evn;
        if ((((evn->registered_events & uVar1 & 1) == 0) ||
            ((*evn->read_callback)(evn->context,CIO_EPOLL_SUCCESS),
            loop->current_ev != (cio_event_notifier *)0x0)) &&
           ((evn->registered_events & uVar1 & 4) != 0)) {
          cStack_40 = CIO_EPOLL_SUCCESS;
          if ((uVar1 & 0x18) != 0) {
            cStack_40 = CIO_EPOLL_ERROR;
          }
          cio_linux_eventloop_unregister_write(loop,evn);
          (*evn->write_callback)(evn->context,cStack_40);
        }
        uVar1 = loop->num_events;
        uVar3 = loop->event_counter + 1;
      }
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return -*piVar2;
}

Assistant:

enum cio_error cio_eventloop_run(struct cio_eventloop *loop)
{
	struct epoll_event *events = loop->epoll_events;

	while (true) {
		int num_events =
		    epoll_wait(loop->epoll_fd, events, CONFIG_MAX_EPOLL_EVENTS, -1);

		if (cio_unlikely(num_events < 0)) {
			if (errno == EINTR) {
				continue;
			}

			return (enum cio_error)(-errno);
		}

		loop->num_events = (unsigned int)num_events;
		for (loop->event_counter = 0; loop->event_counter < loop->num_events; loop->event_counter++) {
			struct cio_event_notifier *evn = events[loop->event_counter].data.ptr;
			if (cio_unlikely(evn == &loop->stop_ev)) {
				goto out;
			}

			uint32_t events_type = events[loop->event_counter].events;
			loop->current_ev = evn;

			if ((events_type & (uint32_t)EPOLLIN & evn->registered_events) != 0) {
				evn->read_callback(evn->context, CIO_EPOLL_SUCCESS);
			}

			handle_removed_ev(loop, evn, events_type);
		}
	}

out:
	return CIO_SUCCESS;
}